

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Error __thiscall asmjit::CodeHolder::reserveBuffer(CodeHolder *this,CodeBuffer *cb,size_t n)

{
  ulong in_RDX;
  CodeBuffer *in_RSI;
  CodeHolder *in_RDI;
  size_t capacity;
  Error local_18;
  
  if (in_RSI->_capacity < in_RDX) {
    if ((in_RSI->_isFixedSize & 1U) == 0) {
      if (in_RDI->_cgAsm != (Assembler *)0x0) {
        (*(in_RDI->_cgAsm->super_CodeEmitter)._vptr_CodeEmitter[0x10])();
      }
      local_18 = CodeHolder_reserveInternal(in_RDI,in_RSI,in_RDX);
    }
    else {
      local_18 = 0xb;
    }
  }
  else {
    local_18 = 0;
  }
  return local_18;
}

Assistant:

Error CodeHolder::reserveBuffer(CodeBuffer* cb, size_t n) noexcept {
  size_t capacity = cb->getCapacity();
  if (n <= capacity) return kErrorOk;

  if (cb->isFixedSize())
    return DebugUtils::errored(kErrorCodeTooLarge);

  // We must sync, as mentioned in `growBuffer()` as well.
  if (_cgAsm) _cgAsm->sync();

  return CodeHolder_reserveInternal(this, cb, n);
}